

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDPrivateKey.cpp
# Opt level: O0

ByteString * __thiscall OSSLEDPrivateKey::PKCS8Encode(OSSLEDPrivateKey *this)

{
  ByteString *in_RDI;
  uchar *p;
  int len;
  PKCS8_PRIV_KEY_INFO *p8;
  EVP_PKEY *key;
  ByteString *der;
  size_t in_stack_ffffffffffffff78;
  OSSLEDPrivateKey *in_stack_ffffffffffffff80;
  uchar *local_48;
  int local_3c;
  PKCS8_PRIV_KEY_INFO *local_38;
  EVP_PKEY *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  ByteString::ByteString((ByteString *)0x12f845);
  local_20 = (EVP_PKEY *)getOSSLKey(in_stack_ffffffffffffff80);
  if ((local_20 != (EVP_PKEY *)0x0) &&
     (local_38 = EVP_PKEY2PKCS8(local_20), local_38 != (PKCS8_PRIV_KEY_INFO *)0x0)) {
    local_3c = i2d_PKCS8_PRIV_KEY_INFO(local_38,(uchar **)0x0);
    if (local_3c < 1) {
      PKCS8_PRIV_KEY_INFO_free(local_38);
    }
    else {
      ByteString::resize((ByteString *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_48 = ByteString::operator[]
                           ((ByteString *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      i2d_PKCS8_PRIV_KEY_INFO(local_38,&local_48);
      PKCS8_PRIV_KEY_INFO_free(local_38);
    }
  }
  return in_RDI;
}

Assistant:

ByteString OSSLEDPrivateKey::PKCS8Encode()
{
	ByteString der;
	EVP_PKEY* key = getOSSLKey();
	if (key == NULL) return der;
	PKCS8_PRIV_KEY_INFO* p8 = EVP_PKEY2PKCS8(key);
	if (p8 == NULL) return der;
	int len = i2d_PKCS8_PRIV_KEY_INFO(p8, NULL);
	if (len <= 0)
	{
		PKCS8_PRIV_KEY_INFO_free(p8);
		return der;
	}
	der.resize(len);
	unsigned char* p = &der[0];
	i2d_PKCS8_PRIV_KEY_INFO(p8, &p);
	PKCS8_PRIV_KEY_INFO_free(p8);
	return der;
}